

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCVWarp.cpp
# Opt level: O3

string * escaped(string *__return_storage_ptr__,string *input)

{
  size_type sVar1;
  pointer pcVar2;
  size_type sVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  sVar1 = input->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (input->_M_dataplus)._M_p;
    sVar3 = 0;
    do {
      if ((byte)(pcVar2[sVar3] - 7U) < 7) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string escaped(const std::string& input)
{
	// https://stackoverflow.com/questions/48260879/how-to-replace-with-in-c-string
    std::string output;
    output.reserve(input.size());
    for (const char c: input) {
        switch (c) {
            case '\a':  output += "\\a";        break;
            case '\b':  output += "\\b";        break;
            case '\f':  output += "\\f";        break;
            case '\n':  output += "\\n";        break;
            case '\r':  output += "\\r";        break;
            case '\t':  output += "\\t";        break;
            case '\v':  output += "\\v";        break;
            default:    output += c;            break;
        }
    }

    return output;
}